

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O0

astcenc_image * imageAllocate(uint32_t bitness,uint32_t dim_x,uint32_t dim_y,uint32_t dim_z)

{
  undefined1 auVar1 [16];
  astcenc_image *paVar2;
  ulong uVar3;
  void **ppvVar4;
  void *pvVar5;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  uint32_t z_2;
  void **data_2;
  uint32_t z_1;
  void **data_1;
  uint32_t z;
  void **data;
  astcenc_image *img;
  uint local_44;
  uint local_34;
  uint local_24;
  
  paVar2 = (astcenc_image *)operator_new(0x18);
  if (paVar2 == (astcenc_image *)0x0) {
    __assert_fail("img",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x4d,"astcenc_image *imageAllocate(uint32_t, uint32_t, uint32_t, uint32_t)");
  }
  paVar2->dim_x = in_ESI;
  paVar2->dim_y = in_EDX;
  paVar2->dim_z = in_ECX;
  if (in_EDI == 8) {
    uVar3 = SUB168(ZEXT416(in_ECX) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_ECX) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppvVar4 = (void **)operator_new__(uVar3);
    paVar2->data_type = ASTCENC_TYPE_U8;
    paVar2->data = ppvVar4;
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      pvVar5 = operator_new__((ulong)(in_ESI * in_EDX * 4));
      ppvVar4[local_24] = pvVar5;
    }
  }
  else if (in_EDI == 0x10) {
    uVar3 = SUB168(ZEXT416(in_ECX) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_ECX) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppvVar4 = (void **)operator_new__(uVar3);
    paVar2->data_type = ASTCENC_TYPE_F16;
    paVar2->data = ppvVar4;
    for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
      auVar1 = ZEXT416(in_ESI * in_EDX * 4) * ZEXT816(2);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar3);
      ppvVar4[local_34] = pvVar5;
    }
  }
  else {
    if (in_EDI != 0x20) {
      __assert_fail("bitness == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                    ,0x66,"astcenc_image *imageAllocate(uint32_t, uint32_t, uint32_t, uint32_t)");
    }
    uVar3 = SUB168(ZEXT416(in_ECX) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_ECX) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppvVar4 = (void **)operator_new__(uVar3);
    paVar2->data_type = ASTCENC_TYPE_F32;
    paVar2->data = ppvVar4;
    for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
      auVar1 = ZEXT416(in_ESI * in_EDX * 4) * ZEXT816(4);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar3);
      ppvVar4[local_44] = pvVar5;
    }
  }
  return paVar2;
}

Assistant:

static astcenc_image*
imageAllocate(uint32_t bitness,
              uint32_t dim_x, uint32_t dim_y, uint32_t dim_z) {
    astcenc_image *img = new astcenc_image;
    assert(img);

    img->dim_x         = dim_x;
    img->dim_y         = dim_y;
    img->dim_z         = dim_z;

    if (bitness == 8) {
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_U8;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new uint8_t[dim_x * dim_y * 4];
        }
    }
    else if (bitness == 16) {
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_F16;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new uint16_t[dim_x * dim_y * 4];
        }
    }
    else {       // if (bitness == 32)
        assert(bitness == 32);
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_F32;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new float[dim_x * dim_y * 4];
        }
    }

    return img;
}